

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv4destination.h
# Opt level: O0

void __thiscall
jrtplib::RTPIPv4Destination::RTPIPv4Destination
          (RTPIPv4Destination *this,uint32_t ip,uint16_t rtpport,uint16_t rtcpport)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint16_t rtcpport_local;
  uint16_t rtpport_local;
  uint32_t ip_local;
  RTPIPv4Destination *this_local;
  
  memset(&this->rtpaddr,0,0x10);
  memset(&this->rtcpaddr,0,0x10);
  (this->rtpaddr).sin_family = 2;
  uVar1 = htons(rtpport);
  (this->rtpaddr).sin_port = uVar1;
  uVar2 = htonl(ip);
  (this->rtpaddr).sin_addr.s_addr = uVar2;
  (this->rtcpaddr).sin_family = 2;
  uVar1 = htons(rtcpport);
  (this->rtcpaddr).sin_port = uVar1;
  uVar2 = htonl(ip);
  (this->rtcpaddr).sin_addr.s_addr = uVar2;
  this->ip = ip;
  return;
}

Assistant:

RTPIPv4Destination(uint32_t ip,uint16_t rtpport,uint16_t rtcpport)
	{
		memset(&rtpaddr,0,sizeof(struct sockaddr_in));
		memset(&rtcpaddr,0,sizeof(struct sockaddr_in));
		
		rtpaddr.sin_family = AF_INET;
		rtpaddr.sin_port = htons(rtpport);
		rtpaddr.sin_addr.s_addr = htonl(ip);
		
		rtcpaddr.sin_family = AF_INET;
		rtcpaddr.sin_port = htons(rtcpport);
		rtcpaddr.sin_addr.s_addr = htonl(ip);

		RTPIPv4Destination::ip = ip;
	}